

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O2

uint __thiscall FuncInfo::AcquireInnerScopeIndex(FuncInfo *this)

{
  uint uVar1;
  
  if (this->currentInnerScopeIndex == 0xffffffff) {
    uVar1 = 0;
  }
  else {
    uVar1 = this->currentInnerScopeIndex + 1;
    if (uVar1 == 0xffffffff) {
      Js::Throw::OutOfMemory();
    }
  }
  if (uVar1 == this->innerScopeCount) {
    this->innerScopeCount = uVar1 + 1;
  }
  this->currentInnerScopeIndex = uVar1;
  return uVar1;
}

Assistant:

uint FuncInfo::AcquireInnerScopeIndex()
{
    uint index = this->currentInnerScopeIndex;
    if (index == (uint)-1)
    {
        index = 0;
    }
    else
    {
        index++;
        if (index == (uint)-1)
        {
            Js::Throw::OutOfMemory();
        }
    }
    if (index == this->innerScopeCount)
    {
        this->innerScopeCount = index + 1;
    }
    this->currentInnerScopeIndex = index;
    return index;
}